

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetLanguages
          (cmGeneratorTarget *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languages,string *config)

{
  pointer ppcVar1;
  pointer ppcVar2;
  bool bVar3;
  string *__v;
  _Base_ptr p_Var4;
  undefined1 auVar5 [8];
  pointer ppcVar6;
  cmGeneratorTarget *gt;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> objectTargets;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  objectLibraries;
  cmGeneratorTarget *local_c0;
  _Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_b8;
  undefined1 local_98 [8];
  pointer ppcStack_90;
  _Base_ptr local_88;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_60;
  
  bVar3 = CanCompileSources(this);
  if (bVar3) {
    local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetSourceFiles(this,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_b8,config)
    ;
    ppcVar1 = local_b8._M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar6 = local_b8._M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
        ppcVar6 = ppcVar6 + 1) {
      __v = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(*ppcVar6);
      if (__v->_M_string_length != 0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)languages,__v);
      }
    }
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == false) {
      local_98 = (undefined1  [8])0x0;
      ppcStack_90 = (pointer)0x0;
      local_88 = (_Base_ptr)0x0;
      GetObjectLibrariesCMP0026
                (this,(vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_98)
      ;
      ppcVar2 = ppcStack_90;
      for (auVar5 = local_98; auVar5 != (undefined1  [8])ppcVar2;
          auVar5 = (undefined1  [8])((long)auVar5 + 8)) {
        local_c0 = *(cmGeneratorTarget **)auVar5;
        std::
        _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
        ::_M_insert_unique<cmGeneratorTarget_const*const&>
                  ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                    *)&local_60,&local_c0);
      }
      std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
                ((_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_98
                );
    }
    else {
      GetSourceObjectLibraries
                ((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *)local_98,this,config);
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
      ::operator=(&local_60,
                  (_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                   *)local_98);
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
      ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                   *)local_98);
    }
    for (p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &local_60._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      GetLanguages(*(cmGeneratorTarget **)(p_Var4 + 1),languages,config);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::~_Rb_tree(&local_60);
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base(&local_b8);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetLanguages(std::set<std::string>& languages,
                                     const std::string& config) const
{
  // Targets that do not compile anything have no languages.
  if (!this->CanCompileSources()) {
    return;
  }

  std::vector<cmSourceFile*> sourceFiles;
  this->GetSourceFiles(sourceFiles, config);
  for (cmSourceFile* src : sourceFiles) {
    const std::string& lang = src->GetOrDetermineLanguage();
    if (!lang.empty()) {
      languages.insert(lang);
    }
  }

  std::set<cmGeneratorTarget const*> objectLibraries;
  if (!this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    std::vector<cmGeneratorTarget*> objectTargets;
    this->GetObjectLibrariesCMP0026(objectTargets);
    for (cmGeneratorTarget* gt : objectTargets) {
      objectLibraries.insert(gt);
    }
  } else {
    objectLibraries = this->GetSourceObjectLibraries(config);
  }
  for (cmGeneratorTarget const* objLib : objectLibraries) {
    objLib->GetLanguages(languages, config);
  }
}